

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

string * __thiscall Klex::parseOutWord_abi_cxx11_(string *__return_storage_ptr__,Klex *this)

{
  CharClass CVar1;
  bool bVar2;
  Klex *this_local;
  string *lexeme;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    CVar1 = getCharClass(this);
    bVar2 = true;
    if (CVar1 != LETTER) {
      CVar1 = getCharClass(this);
      bVar2 = CVar1 == DIGIT;
    }
    if (!bVar2) break;
    getChar(this);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    nextChar(this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutWord() {
    std::string lexeme;

    while(getCharClass() == CharClass::LETTER || getCharClass() == CharClass::DIGIT) {
        lexeme.push_back(getChar());
        nextChar();
    }

    return lexeme;
}